

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O2

void Search::add_example_conditioning
               (search_private *priv,example *ec,size_t condition_on_cnt,char *condition_on_names,
               action_repr *condition_on_actions)

{
  char cVar1;
  wclass *pwVar2;
  features *pfVar3;
  float *pfVar4;
  unsigned_long uVar5;
  example *peVar6;
  ostream *this;
  ostream *poVar7;
  uint32_t *puVar8;
  vw *pvVar9;
  long lVar10;
  size_t n;
  ulong uVar11;
  ulong uVar12;
  size_t k;
  long lVar13;
  ulong uVar14;
  allocator local_c9;
  ulong local_c8;
  ostream *local_c0;
  example *local_b8;
  char *local_b0;
  action_repr *local_a8;
  ulong local_a0;
  stringstream *local_98;
  string *local_90;
  char *local_88;
  ulong local_80;
  long local_78;
  ulong local_70;
  action_repr *local_68;
  long local_60;
  ulong local_58;
  string local_50 [32];
  
  if (condition_on_cnt != 0) {
    if ((priv->is_ldf == true) &&
       (pwVar2 = (ec->l).cs.costs._begin, (ec->l).cs.costs._end != pwVar2)) {
      local_80 = (ulong)(pwVar2->class_index * 0x3abb39);
    }
    else {
      local_80 = 0;
    }
    uVar12 = (priv->acset).max_bias_ngram_length;
    uVar14 = (priv->acset).max_quad_ngram_length;
    if (uVar14 < uVar12) {
      uVar14 = uVar12;
    }
    local_78 = local_80 * 0x81904f + 0x118fd;
    local_98 = &priv->dat_new_feature_audit_ss;
    local_90 = (string *)&priv->field_0x370;
    local_c0 = (ostream *)&priv->field_0x368;
    lVar10 = 0;
    uVar12 = 0;
    local_b8 = ec;
    local_b0 = condition_on_names;
    local_a8 = condition_on_actions;
    local_a0 = condition_on_cnt;
    local_88 = condition_on_names;
    local_58 = uVar14;
    while( true ) {
      local_c8 = uVar12;
      if (uVar12 < local_a0) {
        local_c8 = local_a0;
      }
      if (local_a0 == uVar12) break;
      if (priv->all->audit != false) {
        std::__cxx11::string::string(local_50,"",&local_c9);
        std::__cxx11::stringbuf::str(local_90);
        std::__cxx11::string::~string(local_50);
        std::ios::clear((int)*(undefined8 *)(*(long *)&priv->dat_new_feature_audit_ss + -0x18) +
                        (int)local_98);
        priv->dat_new_feature_feature_space = (string *)condition_feature_space_abi_cxx11_;
      }
      local_c8 = local_c8 + lVar10;
      lVar13 = local_78;
      local_70 = uVar12;
      local_68 = condition_on_actions;
      local_60 = lVar10;
      for (uVar11 = 0; (uVar14 != uVar11 && (local_c8 != uVar11)); uVar11 = uVar11 + 1) {
        cVar1 = local_88[uVar11];
        lVar13 = ((long)cVar1 * 0x118fd + 0x284a40980b5) *
                 (ulong)(condition_on_actions->a + 0x553ad) + lVar13 * 0x504c5;
        priv->dat_new_feature_ec = local_b8;
        priv->dat_new_feature_idx = lVar13 * 0x1aa5cfd;
        priv->dat_new_feature_namespace = 0x86;
        priv->dat_new_feature_value = (priv->acset).feature_value;
        if (priv->all->audit == true) {
          if (uVar11 != 0) {
            std::operator<<(local_c0,',');
          }
          poVar7 = local_c0;
          if ((byte)(cVar1 - 0x21U) < 0x5e) {
            std::ostream::_M_insert<unsigned_long>((ulong)local_c0);
          }
          else {
            this = std::operator<<(local_c0,'#');
            std::ostream::operator<<(this,(int)cVar1);
          }
          poVar7 = std::operator<<(poVar7,'=');
          std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
          uVar14 = local_58;
        }
        if (uVar11 < (priv->acset).max_bias_ngram_length) {
          pvVar9 = priv->all;
          if ((pvVar9->weights).sparse == false) {
            puVar8 = &(pvVar9->weights).dense_weights._stride_shift;
          }
          else {
            puVar8 = &(pvVar9->weights).sparse_weights._stride_shift;
          }
          add_new_feature(priv,1.0,0x431c79L << ((byte)*puVar8 & 0x3f));
        }
        if (uVar11 < (priv->acset).max_quad_ngram_length) {
          GD::foreach_feature<Search::search_private,_unsigned_long,_&Search::add_new_feature>
                    (priv->all,local_b8,priv);
        }
        condition_on_actions = condition_on_actions + 1;
      }
      uVar12 = local_70 + 1;
      lVar10 = local_60 + -1;
      local_88 = local_88 + 1;
      condition_on_actions = local_68 + 1;
    }
    if ((priv->acset).use_passthrough_repr == true) {
      uVar12 = 0;
      while (uVar12 != local_a0) {
        pfVar3 = local_a8[uVar12].repr;
        local_c8 = uVar12;
        if (pfVar3 != (features *)0x0) {
          lVar10 = ((long)local_b0[uVar12] * 0x80107100000000 >> 0x20) + local_80;
          for (uVar12 = 0; pfVar4 = (pfVar3->values)._begin,
              uVar12 < (ulong)((long)(pfVar3->values)._end - (long)pfVar4 >> 2); uVar12 = uVar12 + 1
              ) {
            if (1e-10 < ABS(pfVar4[uVar12])) {
              uVar5 = (pfVar3->indicies)._begin[uVar12];
              pvVar9 = priv->all;
              if (pvVar9->audit == true) {
                std::__cxx11::string::string(local_50,"",&local_c9);
                std::__cxx11::stringbuf::str(local_90);
                std::__cxx11::string::~string(local_50);
                std::ios::clear((int)*(undefined8 *)
                                      (*(long *)&priv->dat_new_feature_audit_ss + -0x18) +
                                (int)local_98);
                poVar7 = std::operator<<(local_c0,"passthrough_repr_");
                poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
                poVar7 = std::operator<<(poVar7,'_');
                std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
                pvVar9 = priv->all;
              }
              priv->dat_new_feature_ec = local_b8;
              priv->dat_new_feature_idx = uVar5 * 0xcd1c9 + lVar10 * 0x2e2185b + 0xf4ed56e4;
              priv->dat_new_feature_namespace = 0x86;
              priv->dat_new_feature_value = (pfVar3->values)._begin[uVar12];
              puVar8 = &(pvVar9->weights).dense_weights._stride_shift;
              if ((pvVar9->weights).sparse != false) {
                puVar8 = &(pvVar9->weights).sparse_weights._stride_shift;
              }
              add_new_feature(priv,1.0,0x431c79L << ((byte)*puVar8 & 0x3f));
            }
          }
        }
        uVar12 = local_c8 + 1;
      }
    }
    peVar6 = local_b8;
    if (((local_b8->super_example_predict).feature_space[0x86].values._end ==
         (local_b8->super_example_predict).feature_space[0x86].values._begin) ||
       ((local_b8->super_example_predict).feature_space[0x86].sum_feat_sq <= 0.0)) {
      features::clear((local_b8->super_example_predict).feature_space + 0x86);
    }
    else {
      v_array<unsigned_char>::push_back((v_array<unsigned_char> *)local_b8,&conditioning_namespace);
      peVar6->total_sum_feat_sq =
           (peVar6->super_example_predict).feature_space[0x86].sum_feat_sq +
           peVar6->total_sum_feat_sq;
      peVar6->num_features =
           peVar6->num_features +
           ((long)(peVar6->super_example_predict).feature_space[0x86].values._end -
            (long)(peVar6->super_example_predict).feature_space[0x86].values._begin >> 2);
    }
  }
  return;
}

Assistant:

void add_example_conditioning(search_private& priv, example& ec, size_t condition_on_cnt,
    const char* condition_on_names, action_repr* condition_on_actions)
{
  if (condition_on_cnt == 0)
    return;

  uint64_t extra_offset = 0;
  if (priv.is_ldf)
    if (ec.l.cs.costs.size() > 0)
      extra_offset = 3849017 * ec.l.cs.costs[0].class_index;

  size_t I = condition_on_cnt;
  size_t N = max(priv.acset.max_bias_ngram_length, priv.acset.max_quad_ngram_length);
  for (size_t i = 0; i < I; i++)  // position in conditioning
  {
    uint64_t fid = 71933 + 8491087 * extra_offset;
    if (priv.all->audit)
    {
      priv.dat_new_feature_audit_ss.str("");
      priv.dat_new_feature_audit_ss.clear();
      priv.dat_new_feature_feature_space = &condition_feature_space;
    }

    for (size_t n = 0; n < N; n++)  // length of ngram
    {
      if (i + n >= I)
        break;  // no more ngrams
      // we're going to add features for the ngram condition_on_actions[i .. i+N]
      uint64_t name = condition_on_names[i + n];
      fid = fid * 328901 + 71933 * ((condition_on_actions[i + n].a + 349101) * (name + 38490137));

      priv.dat_new_feature_ec = &ec;
      priv.dat_new_feature_idx = fid * quadratic_constant;
      priv.dat_new_feature_namespace = conditioning_namespace;
      priv.dat_new_feature_value = priv.acset.feature_value;

      if (priv.all->audit)
      {
        if (n > 0)
          priv.dat_new_feature_audit_ss << ',';
        if ((33 <= name) && (name <= 126))
          priv.dat_new_feature_audit_ss << name;
        else
          priv.dat_new_feature_audit_ss << '#' << (int)name;
        priv.dat_new_feature_audit_ss << '=' << condition_on_actions[i + n].a;
      }

      // add the single bias feature
      if (n < priv.acset.max_bias_ngram_length)
        add_new_feature(priv, 1., (uint64_t)4398201 << priv.all->weights.stride_shift());
      // add the quadratic features
      if (n < priv.acset.max_quad_ngram_length)
        GD::foreach_feature<search_private, uint64_t, add_new_feature>(*priv.all, ec, priv);
    }
  }

  if (priv.acset.use_passthrough_repr)
  {
    cdbg << "BEGIN adding passthrough features" << endl;
    for (size_t i = 0; i < I; i++)
    {
      if (condition_on_actions[i].repr == nullptr)
        continue;
      features& fs = *(condition_on_actions[i].repr);
      char name = condition_on_names[i];
      for (size_t k = 0; k < fs.size(); k++)
        if ((fs.values[k] > 1e-10) || (fs.values[k] < -1e-10))
        {
          uint64_t fid = 84913 + 48371803 * (extra_offset + 8392817 * name) + 840137 * (4891 + fs.indicies[k]);
          if (priv.all->audit)
          {
            priv.dat_new_feature_audit_ss.str("");
            priv.dat_new_feature_audit_ss.clear();
            priv.dat_new_feature_audit_ss << "passthrough_repr_" << i << '_' << k;
          }

          priv.dat_new_feature_ec = &ec;
          priv.dat_new_feature_idx = fid;
          priv.dat_new_feature_namespace = conditioning_namespace;
          priv.dat_new_feature_value = fs.values[k];
          add_new_feature(priv, 1., (uint64_t)4398201 << priv.all->weights.stride_shift());
        }
    }
    cdbg << "END adding passthrough features" << endl;
  }

  features& con_fs = ec.feature_space[conditioning_namespace];
  if ((con_fs.size() > 0) && (con_fs.sum_feat_sq > 0.))
  {
    ec.indices.push_back(conditioning_namespace);
    ec.total_sum_feat_sq += con_fs.sum_feat_sq;
    ec.num_features += con_fs.size();
  }
  else
    con_fs.clear();
}